

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_cli.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  char *local_38;
  
  lVar4 = 1;
  local_38 = (char *)0x0;
  bVar1 = false;
  do {
    if (argc <= lVar4) {
      if ((local_38 == (char *)0x0) || (bVar1)) {
        fprintf(_stderr,"USAGE: %s [args] <altrace.trace>\n",*argv);
        fwrite("  args:\n",8,1,_stderr);
        fwrite("   --[no-]dump-calls\n",0x15,1,_stderr);
        fwrite("   --[no-]dump-callers\n",0x17,1,_stderr);
        fwrite("   --[no-]dump-errors\n",0x16,1,_stderr);
        fwrite("   --[no-]dump-state-changes\n",0x1d,1,_stderr);
        fwrite("   --[no-]dump-all\n",0x13,1,_stderr);
        fwrite("   --[no-]run\n",0xe,1,_stderr);
        fputc(10,_stderr);
        uVar3 = 1;
      }
      else {
        dumping = (byte)(dump_errors | dump_callers | ~dump_calls | dump_state_changes) & 1;
        if (run_calls == '\x01') {
          iVar2 = init_clock();
          if (iVar2 == 0) {
            return 1;
          }
          iVar2 = load_real_openal();
          if (iVar2 == 0) {
            return 1;
          }
        }
        fprintf(_stderr,"\n\n\n%s: Playback OpenAL session from log file \'%s\'\n\n\n",GAppName,
                local_38);
        iVar2 = process_tracelog(local_38,(void *)0x0);
        uVar3 = (uint)(iVar2 == 0);
        if (run_calls == '\x01') {
          close_real_openal();
        }
      }
      return uVar3;
    }
    __s1 = argv[lVar4];
    iVar2 = strcmp(__s1,"--dump-calls");
    if (iVar2 == 0) {
LAB_0010b7e5:
      dump_calls = 0;
      __s1 = local_38;
    }
    else {
      iVar2 = strcmp(__s1,"--no-dump-calls");
      if (iVar2 == 0) {
LAB_0010b802:
        dump_calls = 1;
        __s1 = local_38;
      }
      else {
        iVar2 = strcmp(__s1,"--dump-callers");
        if (iVar2 == 0) {
          dump_callers = 1;
          __s1 = local_38;
        }
        else {
          iVar2 = strcmp(__s1,"--no-dump-callers");
          if (iVar2 == 0) {
            dump_callers = 0;
            __s1 = local_38;
          }
          else {
            iVar2 = strcmp(__s1,"--dump-errors");
            if (iVar2 == 0) {
              dump_errors = 1;
              __s1 = local_38;
            }
            else {
              iVar2 = strcmp(__s1,"--no-dump-errors");
              if (iVar2 == 0) {
                dump_errors = 0;
                __s1 = local_38;
              }
              else {
                iVar2 = strcmp(__s1,"--dump-state-changes");
                if (iVar2 == 0) {
                  dump_state_changes = 1;
                  __s1 = local_38;
                }
                else {
                  iVar2 = strcmp(__s1,"--no-dump-state-changes");
                  if (iVar2 == 0) {
                    dump_state_changes = 0;
                    __s1 = local_38;
                  }
                  else {
                    iVar2 = strcmp(__s1,"--dump-all");
                    if (iVar2 == 0) {
                      dump_state_changes = 1;
                      dump_errors = 1;
                      dump_callers = 1;
                      goto LAB_0010b7e5;
                    }
                    iVar2 = strcmp(__s1,"--no-dump-all");
                    if (iVar2 == 0) {
                      dump_state_changes = 0;
                      dump_errors = 0;
                      dump_callers = 0;
                      goto LAB_0010b802;
                    }
                    iVar2 = strcmp(__s1,"--run");
                    if (iVar2 == 0) {
                      run_calls = '\x01';
                      __s1 = local_38;
                    }
                    else {
                      iVar2 = strcmp(__s1,"--no-run");
                      if (iVar2 == 0) {
                        run_calls = '\0';
                        __s1 = local_38;
                      }
                      else {
                        iVar2 = strcmp(__s1,"--help");
                        if (iVar2 == 0) {
                          bVar1 = true;
                          __s1 = local_38;
                        }
                        else if (local_38 != (char *)0x0) {
                          bVar1 = true;
                          __s1 = local_38;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_38 = __s1;
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    const char *fname = NULL;
    int retval = 0;
    int usage = 0;
    int i;

    for (i = 1; i < argc; i++) {
        const char *arg = argv[i];
        if (strcmp(arg, "--dump-calls") == 0) {
            dump_calls = 1;
        } else if (strcmp(arg, "--no-dump-calls") == 0) {
            dump_calls = 0;
        } else if (strcmp(arg, "--dump-callers") == 0) {
            dump_callers = 1;
        } else if (strcmp(arg, "--no-dump-callers") == 0) {
            dump_callers = 0;
        } else if (strcmp(arg, "--dump-errors") == 0) {
            dump_errors = 1;
        } else if (strcmp(arg, "--no-dump-errors") == 0) {
            dump_errors = 0;
        } else if (strcmp(arg, "--dump-state-changes") == 0) {
            dump_state_changes = 1;
        } else if (strcmp(arg, "--no-dump-state-changes") == 0) {
            dump_state_changes = 0;
        } else if (strcmp(arg, "--dump-all") == 0) {
            dump_calls = dump_callers = dump_errors = dump_state_changes = 1;
        } else if (strcmp(arg, "--no-dump-all") == 0) {
            dump_calls = dump_callers = dump_errors = dump_state_changes = 0;
        } else if (strcmp(arg, "--run") == 0) {
            run_calls = 1;
        } else if (strcmp(arg, "--no-run") == 0) {
            run_calls = 0;
        } else if (strcmp(arg, "--help") == 0) {
            usage = 1;
        } else if (fname == NULL) {
            fname = arg;
        } else {
            usage = 1;
        }
    }

    if (fname == NULL) {
        usage = 1;
    }

    if (usage) {
        fprintf(stderr, "USAGE: %s [args] <altrace.trace>\n", argv[0]);
        fprintf(stderr, "  args:\n");
        fprintf(stderr, "   --[no-]dump-calls\n");
        fprintf(stderr, "   --[no-]dump-callers\n");
        fprintf(stderr, "   --[no-]dump-errors\n");
        fprintf(stderr, "   --[no-]dump-state-changes\n");
        fprintf(stderr, "   --[no-]dump-all\n");
        fprintf(stderr, "   --[no-]run\n");
        fprintf(stderr, "\n");
        return 1;
    }

    dumping = dump_calls || dump_callers || dump_errors || dump_state_changes;

    if (run_calls) {
        if (!init_clock()) {
            return 1;
        }

        if (!load_real_openal()) {
            return 1;
        }
    }

    fprintf(stderr, "\n\n\n%s: Playback OpenAL session from log file '%s'\n\n\n", GAppName, fname);

    if (!process_tracelog(fname, NULL)) {
        retval = 1;
    }

    if (run_calls) {
        close_real_openal();
    }

    return retval;
}